

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 jx9CompileNowdoc(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken *pVal;
  uint in_EAX;
  jx9_value *pObj;
  sxu32 iP2;
  jx9_vm *pVm;
  sxu32 nIdx;
  undefined8 uStack_18;
  
  pVal = pGen->pIn;
  uStack_18 = (ulong)in_EAX;
  pVm = pGen->pVm;
  if ((pVal->sData).nByte == 0) {
    iP2 = 0;
  }
  else {
    pObj = jx9VmReserveConstObj(pVm,(sxu32 *)((long)&uStack_18 + 4));
    if (pObj == (jx9_value *)0x0) {
      jx9GenCompileError(pGen,1,pGen->pIn->nLine,"JX9 engine is running out of memory");
      return -10;
    }
    jx9MemObjInitFromString(pGen->pVm,pObj,&pVal->sData);
    pVm = pGen->pVm;
    iP2 = uStack_18._4_4_;
  }
  jx9VmEmitInstr(pVm,4,0,iP2,(void *)0x0,(sxu32 *)0x0);
  return 0;
}

Assistant:

static sxi32 jx9CompileNowdoc(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	SyString *pStr = &pGen->pIn->sData; /* Constant string literal */
	jx9_value *pObj;
	sxu32 nIdx;
	nIdx = 0; /* Prevent compiler warning */
	if( pStr->nByte <= 0 ){
		/* Empty string, load NULL */
		jx9VmEmitInstr(pGen->pVm,JX9_OP_LOADC, 0, 0, 0, 0);
		return SXRET_OK;
	}
	/* Reserve a new constant */
	pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
	if( pObj == 0 ){
		jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "JX9 engine is running out of memory");
		SXUNUSED(iCompileFlag); /* cc warning */
		return SXERR_ABORT;
	}
	/* No processing is done here, simply a memcpy() operation */
	jx9MemObjInitFromString(pGen->pVm, pObj, pStr);
	/* Emit the load constant instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}